

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::stack_type<std::function<bool_(void_*)>,_std::allocator>::resize
          (stack_type<std::function<bool_(void_*)>,_std::allocator> *this,size_t size)

{
  type *ptVar1;
  stack_type<std::function<bool_(void_*)>,_std::allocator> *in_RSI;
  undefined8 *in_RDI;
  new_allocator<std::aligned_storage<32UL,_8UL>::type> *unaff_retaddr;
  undefined8 *__n;
  
  __n = in_RDI;
  if (in_RDI[3] != 0) {
    destroy(in_RSI);
  }
  in_RDI[4] = in_RSI;
  ptVar1 = __gnu_cxx::new_allocator<std::aligned_storage<32UL,_8UL>::type>::allocate
                     (unaff_retaddr,(size_type)__n,in_RSI);
  in_RDI[3] = ptVar1;
  *in_RDI = in_RDI[3];
  in_RDI[1] = *in_RDI;
  return;
}

Assistant:

void resize(std::size_t size)
		{
			if (m_data != nullptr)
				destroy();
			m_size = size;
			m_data = m_alloc.allocate(m_size);
			m_start = reinterpret_cast<T *>(m_data);
			m_current = m_start;
		}